

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

Beats __thiscall ableton::link::phase(link *this,Beats *beats,Beats *quantum)

{
  long lVar1;
  long lVar2;
  _Head_base<0UL,_long,_false> local_18;
  _Tuple_impl<0UL,_long> local_10;
  
  local_18._M_head_impl =
       (quantum->super_tuple<long>).super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>.
       _M_head_impl;
  if (local_18._M_head_impl == 0) {
    *(undefined8 *)this = 0;
  }
  else {
    lVar1 = (beats->super_tuple<long>).super__Tuple_impl<0UL,_long>.
            super__Head_base<0UL,_long,_false>._M_head_impl;
    lVar2 = -lVar1;
    if (0 < lVar1) {
      lVar2 = lVar1;
    }
    local_10.super__Head_base<0UL,_long,_false>._M_head_impl =
         (_Head_base<0UL,_long,_false>)
         ((lVar1 - (lVar2 + local_18._M_head_impl) % local_18._M_head_impl) +
         lVar2 + local_18._M_head_impl);
    operator%(this,(Beats *)&local_10,(Beats *)&local_18);
  }
  return (tuple<long>)(tuple<long>)this;
}

Assistant:

inline Beats phase(const Beats beats, const Beats quantum)
{
  if (quantum == Beats{INT64_C(0)})
  {
    return Beats{INT64_C(0)};
  }
  else
  {
    // Handle negative beat values by doing the computation relative to an
    // origin that is on the nearest quantum boundary less than -(abs(x))
    const auto quantumMicros = quantum.microBeats();
    const auto quantumBins = (llabs(beats.microBeats()) + quantumMicros) / quantumMicros;
    const std::int64_t quantumBeats{quantumBins * quantumMicros};
    return (beats + Beats{quantumBeats}) % quantum;
  }
}